

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookmem_02.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  MemSegment *pMVar1;
  MemSegment *pMVar2;
  long *plVar3;
  undefined4 *puVar4;
  size_type sVar5;
  void *pvVar6;
  ostream *poVar7;
  int iVar8;
  ulong userSize;
  bool bVar9;
  MallocArena local_2a0;
  NoActionMemLogger local_298 [8];
  undefined **local_290;
  MallocArena *local_288;
  NoActionMemLogger *local_280;
  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> local_278;
  
  local_2a0.m_minSize = 0x10000;
  local_290 = &PTR__MemContext_00106d98;
  local_288 = &local_2a0;
  local_280 = local_298;
  local_278.m_arena = &local_2a0;
  local_278.m_logger = local_298;
  memset(&local_278.m_footprintLimit,0,0x232);
  local_278.m_paddingByte = -0x33;
  local_290 = &PTR__SimpleMemContext_00106d00;
  if (local_278.m_storingExactSize == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x1c);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
LAB_0010244a:
    bVar9 = false;
  }
  else {
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,0x1e);
    if (pvVar6 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x23);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
LAB_00102437:
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      goto LAB_0010244a;
    }
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 0x20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x24);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102437;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,pvVar6,0);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x26);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102437;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,300);
    if (pvVar6 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x29);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102437;
    }
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 0x130) {
      iVar8 = 0x2a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00102fa9:
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_0010244a;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,3000);
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 0xbc0) {
      iVar8 = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x2f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 30000) {
      iVar8 = 0x30;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 30000) {
      iVar8 = 0x32;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x33;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 30000) {
      iVar8 = 0x35;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
    bVar9 = true;
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x36;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102fa9;
    }
  }
  local_290 = &PTR__MemContext_00106d98;
  pMVar2 = local_278.m_segList;
  while (pMVar2 != (MemSegment *)0x0) {
    pMVar1 = pMVar2->m_next;
    free(pMVar2);
    pMVar2 = pMVar1;
  }
  iVar8 = 0x92;
  if (!bVar9) goto LAB_00102d04;
  local_2a0.m_minSize = 0x10000;
  local_290 = &PTR__MemContext_00106d98;
  local_288 = &local_2a0;
  local_280 = local_298;
  local_278.m_arena = &local_2a0;
  local_278.m_logger = local_298;
  memset(&local_278.m_footprintLimit,0,0x232);
  local_278.m_paddingByte = -0x33;
  local_290 = &PTR__SimpleMemContext_00106d00;
  if (local_278.m_storingExactSize == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x40);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
LAB_00102734:
    std::ostream::put((char)plVar3);
    std::ostream::flush();
LAB_001029e1:
    bVar9 = false;
  }
  else {
    if (local_278.m_padding == false) {
      local_278.m_storingExactSize = true;
      local_278.m_padding = false;
    }
    if (local_278.m_storingExactSize == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x42);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102734;
    }
    puVar4 = (undefined4 *)
             cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,0x1e);
    if (puVar4 == (undefined4 *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x47);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
LAB_001029ce:
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      goto LAB_001029e1;
    }
    *(undefined4 *)((long)puVar4 + 0xe) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x12) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x16) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x1a) = 0xffffffff;
    *puVar4 = 0xffffffff;
    puVar4[1] = 0xffffffff;
    puVar4[2] = 0xffffffff;
    puVar4[3] = 0xffffffff;
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,puVar4);
    if (sVar5 != 0x1e) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x49);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_001029ce;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,puVar4,0);
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,300);
    if (pvVar6 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4d);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_001029ce;
    }
    memset(pvVar6,0xff,300);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 300) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4f);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_001029ce;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,3000);
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x52;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00103000:
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_001029e1;
    }
    memset(pvVar6,0xff,3000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 3000) {
      iVar8 = 0x54;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x57;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
    memset(pvVar6,0xff,3000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 30000) {
      iVar8 = 0x59;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 30000) {
      iVar8 = 0x5c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
    memset(pvVar6,0xff,30000);
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x5e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 30000) {
      iVar8 = 0x61;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
    memset(pvVar6,0xff,30000);
    bVar9 = true;
    if (pvVar6 == (void *)0x0) {
      iVar8 = 99;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00103000;
    }
  }
  local_290 = &PTR__MemContext_00106d98;
  pMVar2 = local_278.m_segList;
  while (pMVar2 != (MemSegment *)0x0) {
    pMVar1 = pMVar2->m_next;
    free(pMVar2);
    pMVar2 = pMVar1;
  }
  iVar8 = 0x93;
  if (!bVar9) goto LAB_00102d04;
  local_2a0.m_minSize = 0x10000;
  local_290 = &PTR__MemContext_00106d98;
  local_288 = &local_2a0;
  local_280 = local_298;
  local_278.m_arena = &local_2a0;
  local_278.m_logger = local_298;
  memset(&local_278.m_footprintLimit,0,0x230);
  local_278.m_storingExactSize = true;
  local_278.m_padding = true;
  local_278.m_paddingByte = -0x33;
  local_290 = &PTR__SimpleMemContext_00106d00;
  puVar4 = (undefined4 *)
           cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_278,0x1e);
  if (puVar4 == (undefined4 *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x73);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
LAB_00102cc2:
    std::ostream::put((char)plVar3);
    std::ostream::flush();
LAB_00102cd5:
    bVar9 = false;
  }
  else {
    *(undefined4 *)((long)puVar4 + 0xe) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x12) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x16) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x1a) = 0xffffffff;
    *puVar4 = 0xffffffff;
    puVar4[1] = 0xffffffff;
    puVar4[2] = 0xffffffff;
    puVar4[3] = 0xffffffff;
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,puVar4);
    if (sVar5 != 0x1e) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x75);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102cc2;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,puVar4,0);
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,300);
    if (pvVar6 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x79);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102cc2;
    }
    memset(pvVar6,0xff,300);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 300) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x7b);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      goto LAB_00102cc2;
    }
    pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,3000);
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0x7e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00102da6:
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_00102cd5;
    }
    memset(pvVar6,0xff,3000);
    sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar6);
    if (sVar5 != 3000) {
      iVar8 = 0x80;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102da6;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,pvVar6,0);
    userSize = 30000;
    bVar9 = true;
    do {
      pvVar6 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                         (&local_278,userSize);
      if (pvVar6 == (void *)0x0) {
        iVar8 = 0x86;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00102e85:
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        break;
      }
      memset(pvVar6,0xff,userSize);
      sVar5 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                        (&local_278,pvVar6);
      if (userSize != sVar5) {
        iVar8 = 0x88;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
        goto LAB_00102e85;
      }
      cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
                (&local_278,pvVar6,0);
      bVar9 = userSize < 0x7543;
      userSize = userSize + 1;
    } while (userSize != 0x7544);
    bVar9 = (bool)(bVar9 ^ 1);
  }
  local_290 = &PTR__MemContext_00106d98;
  while (local_278.m_segList != (MemSegment *)0x0) {
    pMVar2 = (local_278.m_segList)->m_next;
    free(local_278.m_segList);
    local_278.m_segList = pMVar2;
  }
  iVar8 = 0x94;
  if (bVar9) {
    return 0;
  }
LAB_00102d04:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mismatch at line ",0x11)
  ;
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return 1;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());
    ASSERT_EQ (0, test2 ());
    ASSERT_EQ (0, test3 ());
    return 0;
}